

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_next(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  
  pTVar2 = index2addr(L,idx);
  iVar1 = luaH_next(L,(Table *)(pTVar2->value_).gc,L->top + -1);
  L->top = L->top + (ulong)(iVar1 != 0) * 2 + -1;
  return iVar1;
}

Assistant:

LUA_API int lua_next(lua_State *L, int idx) {
    StkId t;
    int more;
    lua_lock(L);
    t = index2addr(L, idx);
    api_check(L, ttistable(t), "table expected");
    more = luaH_next(L, hvalue(t), L->top - 1);
    if (more) {
        api_incr_top(L);
    } else  /* no more elements */
        L->top -= 1;  /* remove key */
    lua_unlock(L);
    return more;
}